

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *node,Reader *replacement)

{
  uint uVar1;
  void *pvVar2;
  short sVar3;
  short sVar4;
  uint64_t scopeId;
  uint64_t replacementScopeId;
  Fault f;
  Reader local_88;
  Reader local_58;
  
  if ((node->_reader).dataSize < 0x70) {
    sVar3 = 0;
  }
  else {
    sVar3 = *(short *)((long)(node->_reader).data + 0xc);
  }
  if ((replacement->_reader).dataSize < 0x70) {
    sVar4 = 0;
  }
  else {
    sVar4 = *(short *)((long)(replacement->_reader).data + 0xc);
  }
  if (sVar3 == sVar4) {
    capnp::schema::Node::Reader::getParameters((Reader *)&local_88,replacement);
    uVar1 = (uint)local_88._reader.pointers;
    capnp::schema::Node::Reader::getParameters((Reader *)&local_58,node);
    if ((uint)local_58._reader.pointers < uVar1) {
      replacementIsNewer(this);
    }
    else {
      capnp::schema::Node::Reader::getParameters((Reader *)&local_88,replacement);
      capnp::schema::Node::Reader::getParameters((Reader *)&local_58,node);
      if ((uint)local_88._reader.pointers < (uint)local_58._reader.pointers) {
        replacementIsOlder(this);
      }
    }
    uVar1 = (node->_reader).dataSize;
    if (0x6f < uVar1) {
      pvVar2 = (node->_reader).data;
      sVar3 = *(short *)((long)pvVar2 + 0xc);
      if (sVar3 == 3) {
        local_88._reader.segment = (node->_reader).segment;
        local_88._reader.capTable = (node->_reader).capTable;
        local_88._reader.data = (node->_reader).data;
        local_88._reader.pointers = (node->_reader).pointers;
        local_88._reader.dataSize = (node->_reader).dataSize;
        local_88._reader.pointerCount = (node->_reader).pointerCount;
        local_88._reader._38_2_ = *(undefined2 *)&(node->_reader).field_0x26;
        local_88._reader.nestingLimit = (node->_reader).nestingLimit;
        local_88._reader._44_4_ = *(undefined4 *)&(node->_reader).field_0x2c;
        local_58._reader.segment = (replacement->_reader).segment;
        local_58._reader.capTable = (replacement->_reader).capTable;
        local_58._reader.data = (replacement->_reader).data;
        local_58._reader.pointers = (replacement->_reader).pointers;
        local_58._reader.dataSize = (replacement->_reader).dataSize;
        local_58._reader.pointerCount = (replacement->_reader).pointerCount;
        local_58._reader._38_2_ = *(undefined2 *)&(replacement->_reader).field_0x26;
        local_58._reader.nestingLimit = (replacement->_reader).nestingLimit;
        local_58._reader._44_4_ = *(undefined4 *)&(replacement->_reader).field_0x2c;
        checkCompatibility(this,(Reader *)&local_88,(Reader *)&local_58);
      }
      else if (sVar3 == 2) {
        local_88._reader.segment = (node->_reader).segment;
        local_88._reader.capTable = (node->_reader).capTable;
        local_88._reader.data = (node->_reader).data;
        local_88._reader.pointers = (node->_reader).pointers;
        local_88._reader.dataSize = (node->_reader).dataSize;
        local_88._reader.pointerCount = (node->_reader).pointerCount;
        local_88._reader._38_2_ = *(undefined2 *)&(node->_reader).field_0x26;
        local_88._reader.nestingLimit = (node->_reader).nestingLimit;
        local_88._reader._44_4_ = *(undefined4 *)&(node->_reader).field_0x2c;
        local_58._reader.segment = (replacement->_reader).segment;
        local_58._reader.capTable = (replacement->_reader).capTable;
        local_58._reader.data = (replacement->_reader).data;
        local_58._reader.pointers = (replacement->_reader).pointers;
        local_58._reader.dataSize = (replacement->_reader).dataSize;
        local_58._reader.pointerCount = (replacement->_reader).pointerCount;
        local_58._reader._38_2_ = *(undefined2 *)&(replacement->_reader).field_0x26;
        local_58._reader.nestingLimit = (replacement->_reader).nestingLimit;
        local_58._reader._44_4_ = *(undefined4 *)&(replacement->_reader).field_0x2c;
        checkCompatibility(this,&local_88,&local_58);
      }
      else if (sVar3 == 1) {
        local_88._reader.segment = (node->_reader).segment;
        local_88._reader.capTable = (node->_reader).capTable;
        local_88._reader.data = (node->_reader).data;
        local_88._reader.pointers = (node->_reader).pointers;
        local_88._reader.dataSize = (node->_reader).dataSize;
        local_88._reader.pointerCount = (node->_reader).pointerCount;
        local_88._reader._38_2_ = *(undefined2 *)&(node->_reader).field_0x26;
        local_88._reader.nestingLimit = (node->_reader).nestingLimit;
        local_88._reader._44_4_ = *(undefined4 *)&(node->_reader).field_0x2c;
        local_58._reader.segment = (replacement->_reader).segment;
        local_58._reader.capTable = (replacement->_reader).capTable;
        local_58._reader.data = (replacement->_reader).data;
        local_58._reader.pointers = (replacement->_reader).pointers;
        local_58._reader.dataSize = (replacement->_reader).dataSize;
        local_58._reader.pointerCount = (replacement->_reader).pointerCount;
        local_58._reader._38_2_ = *(undefined2 *)&(replacement->_reader).field_0x26;
        local_58._reader.nestingLimit = (replacement->_reader).nestingLimit;
        local_58._reader._44_4_ = *(undefined4 *)&(replacement->_reader).field_0x2c;
        if (uVar1 < 0xc0) {
          scopeId = 0;
        }
        else {
          scopeId = *(uint64_t *)((long)pvVar2 + 0x10);
        }
        if ((replacement->_reader).dataSize < 0xc0) {
          replacementScopeId = 0;
        }
        else {
          replacementScopeId = *(uint64_t *)((long)(replacement->_reader).data + 0x10);
        }
        checkCompatibility(this,(Reader *)&local_88,(Reader *)&local_58,scopeId,replacementScopeId);
      }
    }
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[28]>
              ((Fault *)&local_88,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x2be,FAILED,"node.which() == replacement.which()","\"kind of declaration changed\""
               ,(char (*) [28])"kind of declaration changed");
    this->compatibility = INCOMPATIBLE;
    kj::_::Debug::Fault::~Fault((Fault *)&local_88);
  }
  return;
}

Assistant:

void checkCompatibility(const schema::Node::Reader& node,
                          const schema::Node::Reader& replacement) {
    // Returns whether `replacement` is equivalent, older than, newer than, or incompatible with
    // `node`.  If exceptions are enabled, this will throw an exception on INCOMPATIBLE.

    VALIDATE_SCHEMA(node.which() == replacement.which(),
                    "kind of declaration changed");

    // No need to check compatibility of most of the non-body parts of the node:
    // - Arbitrary renaming and moving between scopes is allowed.
    // - Annotations are ignored for compatibility purposes.

    if (replacement.getParameters().size() > node.getParameters().size()) {
      replacementIsNewer();
    } else if (replacement.getParameters().size() < node.getParameters().size()) {
      replacementIsOlder();
    }

    switch (node.which()) {
      case schema::Node::FILE:
        verifyVoid(node.getFile());
        break;
      case schema::Node::STRUCT:
        checkCompatibility(node.getStruct(), replacement.getStruct(),
                           node.getScopeId(), replacement.getScopeId());
        break;
      case schema::Node::ENUM:
        checkCompatibility(node.getEnum(), replacement.getEnum());
        break;
      case schema::Node::INTERFACE:
        checkCompatibility(node.getInterface(), replacement.getInterface());
        break;
      case schema::Node::CONST:
        checkCompatibility(node.getConst(), replacement.getConst());
        break;
      case schema::Node::ANNOTATION:
        checkCompatibility(node.getAnnotation(), replacement.getAnnotation());
        break;
    }
  }